

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Lexer * new_lexer(char *file)

{
  void *any;
  Lexer *pLVar1;
  FILE *pFVar2;
  List *pLVar3;
  Lexer *lexer;
  char *file_local;
  
  any = malloc(0x28);
  pLVar1 = (Lexer *)require_not_null(any,"Failed to allocate space");
  pFVar2 = fopen(file,"rb+");
  pLVar1->file = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    perror("timely");
    exit(0);
  }
  pLVar1->source = file;
  pLVar3 = new_list();
  pLVar1->tokens = pLVar3;
  pLVar1->last_chr = 0xd1;
  pLVar1->row_pos = 1;
  pLVar1->col_pos = 1;
  return pLVar1;
}

Assistant:

Lexer *new_lexer(char *file) {
    Lexer *lexer = new(Lexer);
    if ((lexer->file = fopen(file, "rb+")) == NULL) {
        perror("timely");
        exit(0);
    }
    lexer->source = file;
    lexer->tokens = new_list();
    lexer->last_chr = EMPTY;
    lexer->row_pos = 1;
    lexer->col_pos = 1;
    return lexer;
}